

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O0

char * VulkanUtilities::VkObjectTypeToString(VkObjectType ObjectType)

{
  char *pcStack_10;
  VkObjectType ObjectType_local;
  
  if (ObjectType == VK_OBJECT_TYPE_UNKNOWN) {
    pcStack_10 = "unknown";
  }
  else if (ObjectType == VK_OBJECT_TYPE_INSTANCE) {
    pcStack_10 = "instance";
  }
  else if (ObjectType == VK_OBJECT_TYPE_PHYSICAL_DEVICE) {
    pcStack_10 = "physical device";
  }
  else if (ObjectType == VK_OBJECT_TYPE_DEVICE) {
    pcStack_10 = "device";
  }
  else if (ObjectType == VK_OBJECT_TYPE_QUEUE) {
    pcStack_10 = "queue";
  }
  else if (ObjectType == VK_OBJECT_TYPE_SEMAPHORE) {
    pcStack_10 = "semaphore";
  }
  else if (ObjectType == VK_OBJECT_TYPE_COMMAND_BUFFER) {
    pcStack_10 = "cmd buffer";
  }
  else if (ObjectType == VK_OBJECT_TYPE_FENCE) {
    pcStack_10 = "fence";
  }
  else if (ObjectType == VK_OBJECT_TYPE_DEVICE_MEMORY) {
    pcStack_10 = "memory";
  }
  else if (ObjectType == VK_OBJECT_TYPE_BUFFER) {
    pcStack_10 = "buffer";
  }
  else if (ObjectType == VK_OBJECT_TYPE_IMAGE) {
    pcStack_10 = "image";
  }
  else if (ObjectType == VK_OBJECT_TYPE_EVENT) {
    pcStack_10 = "event";
  }
  else if (ObjectType == VK_OBJECT_TYPE_QUERY_POOL) {
    pcStack_10 = "query pool";
  }
  else if (ObjectType == VK_OBJECT_TYPE_BUFFER_VIEW) {
    pcStack_10 = "buffer view";
  }
  else if (ObjectType == VK_OBJECT_TYPE_IMAGE_VIEW) {
    pcStack_10 = "image view";
  }
  else if (ObjectType == VK_OBJECT_TYPE_SHADER_MODULE) {
    pcStack_10 = "shader module";
  }
  else if (ObjectType == VK_OBJECT_TYPE_PIPELINE_CACHE) {
    pcStack_10 = "pipeline cache";
  }
  else if (ObjectType == VK_OBJECT_TYPE_PIPELINE_LAYOUT) {
    pcStack_10 = "pipeline layout";
  }
  else if (ObjectType == VK_OBJECT_TYPE_RENDER_PASS) {
    pcStack_10 = "render pass";
  }
  else if (ObjectType == VK_OBJECT_TYPE_PIPELINE) {
    pcStack_10 = "pipeline";
  }
  else if (ObjectType == VK_OBJECT_TYPE_DESCRIPTOR_SET_LAYOUT) {
    pcStack_10 = "descriptor set layout";
  }
  else if (ObjectType == VK_OBJECT_TYPE_SAMPLER) {
    pcStack_10 = "sampler";
  }
  else if (ObjectType == VK_OBJECT_TYPE_DESCRIPTOR_POOL) {
    pcStack_10 = "descriptor pool";
  }
  else if (ObjectType == VK_OBJECT_TYPE_DESCRIPTOR_SET) {
    pcStack_10 = "descriptor set";
  }
  else if (ObjectType == VK_OBJECT_TYPE_FRAMEBUFFER) {
    pcStack_10 = "framebuffer";
  }
  else if (ObjectType == VK_OBJECT_TYPE_COMMAND_POOL) {
    pcStack_10 = "command pool";
  }
  else if (ObjectType == VK_OBJECT_TYPE_SURFACE_KHR) {
    pcStack_10 = "surface KHR";
  }
  else if (ObjectType == VK_OBJECT_TYPE_SWAPCHAIN_KHR) {
    pcStack_10 = "swapchain KHR";
  }
  else if (ObjectType == VK_OBJECT_TYPE_DISPLAY_KHR) {
    pcStack_10 = "display KHR";
  }
  else if (ObjectType == VK_OBJECT_TYPE_DISPLAY_MODE_KHR) {
    pcStack_10 = "display mode KHR";
  }
  else if (ObjectType == VK_OBJECT_TYPE_DEBUG_REPORT_CALLBACK_EXT) {
    pcStack_10 = "debug report callback";
  }
  else if (ObjectType == VK_OBJECT_TYPE_DESCRIPTOR_UPDATE_TEMPLATE) {
    pcStack_10 = "descriptor update template";
  }
  else if (ObjectType == VK_OBJECT_TYPE_DEBUG_UTILS_MESSENGER_EXT) {
    pcStack_10 = "debug utils messenger";
  }
  else if (ObjectType == VK_OBJECT_TYPE_ACCELERATION_STRUCTURE_KHR) {
    pcStack_10 = "acceleration structure KHR";
  }
  else if (ObjectType == VK_OBJECT_TYPE_SAMPLER_YCBCR_CONVERSION) {
    pcStack_10 = "sampler ycbcr conversion";
  }
  else if (ObjectType == VK_OBJECT_TYPE_VALIDATION_CACHE_EXT) {
    pcStack_10 = "validation cache EXT";
  }
  else if (ObjectType == VK_OBJECT_TYPE_PERFORMANCE_CONFIGURATION_INTEL) {
    pcStack_10 = "performance configuration INTEL";
  }
  else if (ObjectType == VK_OBJECT_TYPE_DEFERRED_OPERATION_KHR) {
    pcStack_10 = "deferred operation KHR";
  }
  else if (ObjectType == VK_OBJECT_TYPE_INDIRECT_COMMANDS_LAYOUT_NV) {
    pcStack_10 = "indirect commands layout NV";
  }
  else if (ObjectType == VK_OBJECT_TYPE_PRIVATE_DATA_SLOT) {
    pcStack_10 = "private data slot EXT";
  }
  else {
    pcStack_10 = "unknown";
  }
  return pcStack_10;
}

Assistant:

const char* VkObjectTypeToString(VkObjectType ObjectType)
{
    switch (ObjectType)
    {
        // clang-format off
        case VK_OBJECT_TYPE_UNKNOWN:                        return "unknown";
        case VK_OBJECT_TYPE_INSTANCE:                       return "instance";
        case VK_OBJECT_TYPE_PHYSICAL_DEVICE:                return "physical device";
        case VK_OBJECT_TYPE_DEVICE:                         return "device";
        case VK_OBJECT_TYPE_QUEUE:                          return "queue";
        case VK_OBJECT_TYPE_SEMAPHORE:                      return "semaphore";
        case VK_OBJECT_TYPE_COMMAND_BUFFER:                 return "cmd buffer";
        case VK_OBJECT_TYPE_FENCE:                          return "fence";
        case VK_OBJECT_TYPE_DEVICE_MEMORY:                  return "memory";
        case VK_OBJECT_TYPE_BUFFER:                         return "buffer";
        case VK_OBJECT_TYPE_IMAGE:                          return "image";
        case VK_OBJECT_TYPE_EVENT:                          return "event";
        case VK_OBJECT_TYPE_QUERY_POOL:                     return "query pool";
        case VK_OBJECT_TYPE_BUFFER_VIEW:                    return "buffer view";
        case VK_OBJECT_TYPE_IMAGE_VIEW:                     return "image view";
        case VK_OBJECT_TYPE_SHADER_MODULE:                  return "shader module";
        case VK_OBJECT_TYPE_PIPELINE_CACHE:                 return "pipeline cache";
        case VK_OBJECT_TYPE_PIPELINE_LAYOUT:                return "pipeline layout";
        case VK_OBJECT_TYPE_RENDER_PASS:                    return "render pass";
        case VK_OBJECT_TYPE_PIPELINE:                       return "pipeline";
        case VK_OBJECT_TYPE_DESCRIPTOR_SET_LAYOUT:          return "descriptor set layout";
        case VK_OBJECT_TYPE_SAMPLER:                        return "sampler";
        case VK_OBJECT_TYPE_DESCRIPTOR_POOL:                return "descriptor pool";
        case VK_OBJECT_TYPE_DESCRIPTOR_SET:                 return "descriptor set";
        case VK_OBJECT_TYPE_FRAMEBUFFER:                    return "framebuffer";
        case VK_OBJECT_TYPE_COMMAND_POOL:                   return "command pool";
        case VK_OBJECT_TYPE_SAMPLER_YCBCR_CONVERSION:       return "sampler ycbcr conversion";
        case VK_OBJECT_TYPE_DESCRIPTOR_UPDATE_TEMPLATE:     return "descriptor update template";
        case VK_OBJECT_TYPE_SURFACE_KHR:                    return "surface KHR";
        case VK_OBJECT_TYPE_SWAPCHAIN_KHR:                  return "swapchain KHR";
        case VK_OBJECT_TYPE_DISPLAY_KHR:                    return "display KHR";
        case VK_OBJECT_TYPE_DISPLAY_MODE_KHR:               return "display mode KHR";
        case VK_OBJECT_TYPE_DEBUG_REPORT_CALLBACK_EXT:      return "debug report callback";
        case VK_OBJECT_TYPE_DEBUG_UTILS_MESSENGER_EXT:      return "debug utils messenger";
        case VK_OBJECT_TYPE_ACCELERATION_STRUCTURE_KHR:     return "acceleration structure KHR";
        case VK_OBJECT_TYPE_VALIDATION_CACHE_EXT:           return "validation cache EXT";
        case VK_OBJECT_TYPE_PERFORMANCE_CONFIGURATION_INTEL:return "performance configuration INTEL";
        case VK_OBJECT_TYPE_DEFERRED_OPERATION_KHR:         return "deferred operation KHR";
        case VK_OBJECT_TYPE_INDIRECT_COMMANDS_LAYOUT_NV:    return "indirect commands layout NV";
        case VK_OBJECT_TYPE_PRIVATE_DATA_SLOT_EXT:          return "private data slot EXT";
        default: return "unknown";
            // clang-format on
    }
}